

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O3

void __thiscall indk::Neuron::doFinalize(Neuron *this)

{
  pointer ppVar1;
  pointer pcVar2;
  pointer ppRVar3;
  pointer ppRVar4;
  pointer ppVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  E;
  long *local_50 [2];
  long local_40 [2];
  Entry *local_30;
  
  ppVar5 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    do {
      pcVar2 = (ppVar5->first)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + (ppVar5->first)._M_string_length);
      local_30 = ppVar5->second;
      Entry::doFinalize(local_30);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  ppRVar3 = (this->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar4 = (this->Receptors).
                 super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar4 != ppRVar3;
      ppRVar4 = ppRVar4 + 1) {
    Receptor::doLock(*ppRVar4);
  }
  this->Learned = true;
  return;
}

Assistant:

void indk::Neuron::doFinalize() {
    for (auto E: Entries) E.second -> doFinalize();
    for (auto R: Receptors) R -> doLock();
    Learned = true;
}